

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

void __thiscall ExecutablePcodeSleigh::restoreXml(ExecutablePcodeSleigh *this,Element *el)

{
  bool bVar1;
  LowlevelError *this_00;
  pointer ppEVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  InjectPayload::restoreXml((InjectPayload *)this,el);
  bVar3 = false;
  for (ppEVar2 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar2 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    bVar1 = std::operator==(&(*ppEVar2)->name,"body");
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&this->parsestring);
      bVar3 = true;
    }
  }
  if (bVar3) {
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  (*(this->super_ExecutablePcode).super_InjectPayload._vptr_InjectPayload[5])(&local_70);
  std::operator+(&local_50,"Missing <body> subtag in <pcode>: ",&local_70);
  LowlevelError::LowlevelError(this_00,&local_50);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void ExecutablePcodeSleigh::restoreXml(const Element *el)

{
  InjectPayload::restoreXml(el);
  const List &list(el->getChildren());
  List::const_iterator iter;
  bool hasbody = false;
  for (iter = list.begin(); iter != list.end(); ++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "body") {
      hasbody = true;
      parsestring = subel->getContent();
    }
  }
  if (!hasbody)
    throw LowlevelError("Missing <body> subtag in <pcode>: " + getSource());
}